

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

string * cs::exception::compose_what
                   (string *__return_storage_ptr__,string *file,size_t line,string *code,
                   string *what)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_t sVar8;
  long *plVar9;
  size_type *psVar10;
  char cVar11;
  ulong uVar12;
  string __str;
  ulong *local_130;
  uint local_128;
  undefined4 uStack_124;
  ulong local_120 [2];
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"File \"",file);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_e0 = *puVar7;
    lStack_d8 = plVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar7;
    local_f0 = (ulong *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar11 = '\x01';
  if (9 < line) {
    sVar8 = line;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (sVar8 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_0013775c;
      }
      if (sVar8 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_0013775c;
      }
      if (sVar8 < 10000) goto LAB_0013775c;
      bVar2 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar2);
    cVar11 = cVar11 + '\x01';
  }
LAB_0013775c:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_130,local_128,line);
  uVar1 = CONCAT44(uStack_124,local_128) + local_e8;
  uVar12 = 0xf;
  if (local_f0 != &local_e0) {
    uVar12 = local_e0;
  }
  if (uVar12 < uVar1) {
    uVar12 = 0xf;
    if (local_130 != local_120) {
      uVar12 = local_120[0];
    }
    if (uVar1 <= uVar12) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_f0);
      goto LAB_001377e0;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130);
LAB_001377e0:
  local_110 = &local_100;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_100 = *plVar5;
    uStack_f8 = puVar6[3];
  }
  else {
    local_100 = *plVar5;
    local_110 = (long *)*puVar6;
  }
  local_108 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_d0 = &local_c0;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_c0 = *plVar9;
    lStack_b8 = plVar5[3];
  }
  else {
    local_c0 = *plVar9;
    local_d0 = (long *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(what->_M_dataplus)._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_a0 = *plVar9;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar9;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar9;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(code->_M_dataplus)._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar9;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string compose_what(const std::string &file, std::size_t line, const std::string &code, const std::string &what)
		{
			return "File \"" + file + "\", line " + std::to_string(line) + ": " + what + "\n>\t" + code + "\n";
		}